

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.h
# Opt level: O2

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender_ConnectedItem::ByteSizeLong
          (ItemSimilarityRecommender_ConnectedItem *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  
  if (this->itemid_ == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = this->itemid_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = sVar3;
  if (this->similarityscore_ != 0.0) {
    sVar4 = sVar3 + 9;
  }
  if (NAN(this->similarityscore_)) {
    sVar4 = sVar3 + 9;
  }
  this->_cached_size_ = (int)sVar4;
  return sVar4;
}

Assistant:

inline ::google::protobuf::uint64 ItemSimilarityRecommender_ConnectedItem::itemid() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.ItemSimilarityRecommender.ConnectedItem.itemId)
  return itemid_;
}